

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O3

size_t __thiscall
std::hash<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>_>::operator()
          (hash<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_> *this,
          AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_> *x)

{
  size_t sVar1;
  ulong uVar2;
  hash<mp::LinTerms> local_1a;
  hash<double> local_19;
  
  sVar1 = hash<mp::LinTerms>::operator()(&local_1a,&x->super_LinTerms);
  uVar2 = sVar1 + 0x9e3779b9;
  sVar1 = hash<double>::operator()(&local_19,(x->super_AlgConRhs<_2>).rhs_);
  return sVar1 + (uVar2 >> 2) + uVar2 * 0x40 + 0x9e3779b9 ^ uVar2;
}

Assistant:

size_t operator()(
        const mp::AlgebraicConstraint<Body, RangeOrRhs>& x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Body>{}(x.GetBody()));
    hs.Add(std::hash<RangeOrRhs>{}(x.GetRhsOrRange()));
    return hs.FinalizeHashValue();
  }